

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInputSource.cc
# Opt level: O0

void __thiscall FileInputSource::~FileInputSource(FileInputSource *this)

{
  FileInputSource *this_local;
  
  ~FileInputSource(this);
  operator_delete(this,0xd8);
  return;
}

Assistant:

FileInputSource::~FileInputSource()
{
    // Must be explicit and not inline -- see QPDF_DLL_CLASS in README-maintainer
    if (this->file && this->close_file) {
        fclose(this->file);
    }
}